

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Min::~Min(Min *this)

{
  CFloatFunc2::~CFloatFunc2((CFloatFunc2 *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Max (void) : PreciseFunc2("max", deMax) {}